

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowDemoWindowTables::MyTreeNode::DisplayNode(MyTreeNode *node,MyTreeNode *all_nodes)

{
  byte bVar1;
  MyTreeNode *in_RSI;
  char *in_RDI;
  int child_n;
  bool open;
  bool is_folder;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  undefined2 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 uVar3;
  ImGuiTreeNodeFlags flags;
  
  ImGui::TableNextRow((ImGuiTableRowFlags)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0));
  ImGui::TableNextColumn();
  uVar3 = 0 < *(int *)(in_RDI + 0x18);
  flags = (ImGuiTreeNodeFlags)((ulong)in_RSI >> 0x20);
  if ((bool)uVar3) {
    bVar1 = ImGui::TreeNodeEx(in_RDI,flags);
    ImGui::TableNextColumn();
    ImGui::TextDisabled("--");
    ImGui::TableNextColumn();
    ImGui::TextUnformatted
              ((char *)in_RSI,
               (char *)CONCAT17(uVar3,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffec,
                                                              in_stack_ffffffffffffffe8))));
    if ((bVar1 & 1) != 0) {
      for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x18); iVar2 = iVar2 + 1) {
        DisplayNode(in_RSI,(MyTreeNode *)
                           CONCAT17(uVar3,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffec,iVar2)))
                   );
      }
      ImGui::TreePop();
    }
  }
  else {
    ImGui::TreeNodeEx(in_RDI,flags);
    ImGui::TableNextColumn();
    ImGui::Text("%d",(ulong)*(uint *)(in_RDI + 0x10));
    ImGui::TableNextColumn();
    ImGui::TextUnformatted
              ((char *)in_RSI,
               (char *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffffee,
                                               CONCAT24(in_stack_ffffffffffffffec,
                                                        in_stack_ffffffffffffffe8))));
  }
  return;
}

Assistant:

static void DisplayNode(const MyTreeNode* node, const MyTreeNode* all_nodes)
                {
                    ImGui::TableNextRow();
                    ImGui::TableNextColumn();
                    const bool is_folder = (node->ChildCount > 0);
                    if (is_folder)
                    {
                        bool open = ImGui::TreeNodeEx(node->Name, ImGuiTreeNodeFlags_SpanFullWidth);
                        ImGui::TableNextColumn();
                        ImGui::TextDisabled("--");
                        ImGui::TableNextColumn();
                        ImGui::TextUnformatted(node->Type);
                        if (open)
                        {
                            for (int child_n = 0; child_n < node->ChildCount; child_n++)
                                DisplayNode(&all_nodes[node->ChildIdx + child_n], all_nodes);
                            ImGui::TreePop();
                        }
                    }
                    else
                    {
                        ImGui::TreeNodeEx(node->Name, ImGuiTreeNodeFlags_Leaf | ImGuiTreeNodeFlags_Bullet | ImGuiTreeNodeFlags_NoTreePushOnOpen | ImGuiTreeNodeFlags_SpanFullWidth);
                        ImGui::TableNextColumn();
                        ImGui::Text("%d", node->Size);
                        ImGui::TableNextColumn();
                        ImGui::TextUnformatted(node->Type);
                    }
                }